

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O2

optional<long> __thiscall
wallet::CCoinControl::GetInputWeight(CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  _Storage<long,_true> _Var2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  long in_FS_OFFSET;
  optional<long> oVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = (_Storage<long,_true>)
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::find(&(this->m_selected)._M_t,outpoint);
  if ((_Rb_tree_header *)_Var2._M_value == &(this->m_selected)._M_t._M_impl.super__Rb_tree_header) {
    uVar3 = 0;
  }
  else {
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),
                     (char)((_Base_ptr)(_Var2._M_value + 0x80))->_M_color);
    _Var2._M_value = ((_Storage<long,_true> *)(_Var2._M_value + 0x78))->_M_value;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar3;
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var2._M_value;
    return (optional<long>)
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> CCoinControl::GetInputWeight(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() ? it->second.GetInputWeight() : std::nullopt;
}